

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O1

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,int,int,int,int),char_data*&,int&,int&,int&,int&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_int_int_int_int *func,char_data **args,int *args_1,int *args_2,
          int *args_3,int *args_4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  char_data *pcVar6;
  string *args_00;
  string_view fmt;
  string_view fmt_00;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_int_&,_int_&,_int_&,_int_&> tuple;
  int local_10c;
  string *local_108;
  string *local_100;
  CQueue *local_f8;
  vector<char_data_*,_std::allocator<char_data_*>_> local_f0;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  vector<char_data_*,_std::allocator<char_data_*>_> local_90;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  tuple<char_data_*&,_int_&,_int_&,_int_&,_int_&> local_58;
  
  local_10c = nTimer;
  if (nTimer < 0) {
    local_d8 = (undefined1  [8])0x5;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_d8);
  }
  local_58.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Tuple_impl<2UL,_int_&,_int_&,_int_&>.
  super__Tuple_impl<3UL,_int_&,_int_&>.super__Tuple_impl<4UL,_int_&>.
  super__Head_base<4UL,_int_&,_false>._M_head_impl =
       (_Head_base<4UL,_int_&,_false>)(_Head_base<4UL,_int_&,_false>)args_4;
  local_58.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Tuple_impl<2UL,_int_&,_int_&,_int_&>.
  super__Tuple_impl<3UL,_int_&,_int_&>.super__Head_base<3UL,_int_&,_false>._M_head_impl = args_3;
  local_58.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Tuple_impl<2UL,_int_&,_int_&,_int_&>.
  super__Head_base<2UL,_int_&,_false>._M_head_impl = args_2;
  local_58.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Tuple_impl<1UL,_int_&,_int_&,_int_&,_int_&>.super__Head_base<1UL,_int_&,_false>.
  _M_head_impl = args_1;
  local_58.super__Tuple_impl<0UL,_char_data_*&,_int_&,_int_&,_int_&,_int_&>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,int&,int&,int&,int&>(&local_f0,this,&local_58);
  local_d8._0_4_ = local_10c;
  local_d0._M_p = (pointer)&local_c0;
  pcVar5 = (from->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar5,pcVar5 + from->_M_string_length);
  local_b0._M_p = (pointer)&local_a0;
  pcVar5 = (funcName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar5,pcVar5 + funcName->_M_string_length);
  local_108 = funcName;
  local_100 = from;
  local_f8 = this;
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_90,&local_f0);
  pcVar6 = *args;
  iVar1 = *args_1;
  iVar2 = *args_2;
  iVar3 = *args_3;
  iVar4 = *args_4;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x20);
  *(_func_void_char_data_ptr_int_int_int_int **)local_78._M_unused._0_8_ = func;
  *(char_data **)((long)local_78._M_unused._0_8_ + 8) = pcVar6;
  *(int *)((long)local_78._M_unused._0_8_ + 0x10) = iVar1;
  *(int *)((long)local_78._M_unused._0_8_ + 0x14) = iVar2;
  *(int *)((long)local_78._M_unused._0_8_ + 0x18) = iVar3;
  *(int *)((long)local_78._M_unused._0_8_ + 0x1c) = iVar4;
  p_Stack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/queue.h:45:52)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/queue.h:45:52)>
             ::_M_manager;
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&local_f8->newQueue,(queueEntry_t *)local_d8);
  args_00 = local_100;
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_90.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,args_00,local_108,&local_10c);
  if (local_f0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}